

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

void __thiscall
mp::BasicExprFactory<std::allocator<char>_>::AddFunctions
          (BasicExprFactory<std::allocator<char>_> *this,int num_funcs)

{
  SafeInt<int> SVar1;
  size_type in_RDI;
  vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_> *unaff_retaddr;
  unsigned_long in_stack_00000008;
  SafeInt<int> *in_stack_00000010;
  int in_stack_ffffffffffffffdc;
  
  SVar1.value_ = (int)in_RDI + 0x20;
  std::vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>::size
            ((vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_> *)
             (in_RDI + 0x20));
  SafeInt<int>::SafeInt<unsigned_long>(in_stack_00000010,in_stack_00000008);
  SVar1 = operator+(SVar1,in_stack_ffffffffffffffdc);
  mp::val(SVar1);
  std::vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>::resize
            (unaff_retaddr,in_RDI);
  return;
}

Assistant:

void AddFunctions(int num_funcs) {
    MP_ASSERT(num_funcs >= 0, "invalid size");
    funcs_.resize(val(SafeInt<int>(funcs_.size()) + num_funcs));
  }